

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack6_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar10 [32];
  
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x101010000000000));
  uVar3 = *(ulong *)in;
  *out = (uint)uVar3 & 0x3f;
  uVar2 = (uint)(uVar3 >> 0x20);
  auVar11 = vpermd_avx2(auVar11,ZEXT832(uVar3));
  auVar13 = vpmovsxbd_avx2(ZEXT816(0x100a041e18120c06));
  auVar7 = vpbroadcastd_avx512vl();
  auVar8 = vpsrlvd_avx2(auVar11,auVar13);
  auVar9._8_4_ = 0x3f;
  auVar9._0_8_ = 0x3f0000003f;
  auVar9._12_4_ = 0x3f;
  auVar10._16_4_ = 0x3f;
  auVar10._0_16_ = auVar9;
  auVar10._20_4_ = 0x3f;
  auVar10._24_4_ = 0x3f;
  auVar10._28_4_ = 0x3f;
  auVar11 = vpand_avx2(auVar8,auVar10);
  auVar8 = vpor_avx2(auVar8,auVar7);
  auVar11 = vpblendd_avx2(auVar11,auVar8,0x10);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x140e0802));
  *(undefined1 (*) [32])(out + 1) = auVar11;
  out[9] = uVar2 >> 0x16 & 0x3f;
  auVar5 = vpbroadcastd_avx512vl();
  auVar6 = vpbroadcastd_avx512vl();
  uVar1 = in[4];
  auVar5 = vpsrlvd_avx2(auVar5,auVar4);
  auVar6 = vpsrlvd_avx2(auVar6,auVar13._0_16_);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(in + 2);
  auVar8._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar5;
  auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar12;
  auVar11._0_8_ = auVar6._0_8_;
  auVar11._8_8_ = auVar11._0_8_;
  auVar11._16_8_ = auVar11._0_8_;
  auVar11._24_8_ = auVar11._0_8_;
  out[10] = uVar2 >> 0x1c | ((uint)*(ulong *)(in + 2) & 3) << 4;
  uVar2 = in[5];
  auVar11 = vpblendd_avx2(auVar8,auVar11,0xc0);
  auVar13 = vpsrld_avx2(auVar8,0x1a);
  auVar11 = vpand_avx2(auVar11,auVar10);
  auVar13 = vpblendd_avx2(auVar11,auVar13,0x10);
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x3030303000000));
  *(undefined1 (*) [32])(out + 0xb) = auVar13;
  auVar5 = vpshufd_avx(auVar12,0x55);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  auVar8 = vpbroadcastd_avx512vl();
  auVar13._8_4_ = 0x30;
  auVar13._0_8_ = 0x3000000030;
  auVar13._12_4_ = 0x30;
  auVar13._16_4_ = 0x30;
  auVar13._20_4_ = 0x30;
  auVar13._24_4_ = 0x30;
  auVar13._28_4_ = 0x30;
  auVar8 = vpandd_avx512vl(auVar8,auVar13);
  auVar13 = vpbroadcastd_avx512vl();
  auVar11 = vpermd_avx2(auVar11,ZEXT1632(auVar5));
  auVar11 = vpsrlvd_avx2(auVar11,_DAT_0018ce60);
  auVar5 = vpinsrd_avx(auVar9,uVar1 * 4 & 0x3c,2);
  auVar13 = vpblendd_avx2(ZEXT1632(auVar5),auVar13,0x80);
  auVar8 = vpblendd_avx2(auVar11,auVar8,0xf0);
  auVar11 = vpand_avx2(auVar11,auVar10);
  auVar13 = vpor_avx2(auVar8,auVar13);
  auVar11 = vpblendd_avx2(auVar11,auVar13,0x84);
  *(undefined1 (*) [32])(out + 0x13) = auVar11;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,auVar4);
  auVar5 = vpand_avx(auVar5,auVar9);
  *(undefined1 (*) [16])(out + 0x1b) = auVar5;
  out[0x1f] = uVar2 >> 0x1a;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack6_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;

  return in;
}